

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

char * TargetPropertyNode::GetErrorText(string *targetName,string *propertyName)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  if ((GetErrorText(std::__cxx11::string_const&,std::__cxx11::string_const&)::propertyNameValidator
       == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetErrorText(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::propertyNameValidator), iVar2 != 0)) {
    GetErrorText::propertyNameValidator.regmatch.startp[0] = (char *)0x0;
    GetErrorText::propertyNameValidator.regmatch.endp[0] = (char *)0x0;
    GetErrorText::propertyNameValidator.regmatch.searchstring = (char *)0x0;
    GetErrorText::propertyNameValidator.program = (char *)0x0;
    cmsys::RegularExpression::compile(&GetErrorText::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetErrorText::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&GetErrorText(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         propertyNameValidator);
  }
  if (targetName->_M_string_length == 0) {
    pcVar3 = "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name.";
    if (propertyName->_M_string_length == 0) {
      pcVar3 = 
      "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name and property name.";
    }
  }
  else {
    bVar1 = cmGeneratorExpression::IsValidTargetName(targetName);
    if (bVar1) {
      pcVar3 = (char *)0x0;
    }
    else {
      bVar1 = cmsys::RegularExpression::find
                        (&GetErrorText::propertyNameValidator,(propertyName->_M_dataplus)._M_p,
                         &GetErrorText::propertyNameValidator.regmatch);
      pcVar3 = "Target name and property name not supported.";
      if (bVar1) {
        pcVar3 = "Target name not supported.";
      }
    }
  }
  return pcVar3;
}

Assistant:

static const char* GetErrorText(std::string const& targetName,
                                  std::string const& propertyName)
  {
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");
    if (targetName.empty() && propertyName.empty()) {
      return "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
             "target name and property name.";
    }
    if (targetName.empty()) {
      return "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
             "target name.";
    }
    if (!cmGeneratorExpression::IsValidTargetName(targetName)) {
      if (!propertyNameValidator.find(propertyName)) {
        return "Target name and property name not supported.";
      }
      return "Target name not supported.";
    }
    return nullptr;
  }